

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::InsertInclude(cmTarget *this,cmValueWithOrigin *entry,bool before)

{
  cmTargetInternals *pcVar1;
  TargetPropertyEntry *this_00;
  cmGeneratorExpression local_68;
  cmCompiledGeneratorExpression *local_60;
  auto_ptr<cmCompiledGeneratorExpression> local_58;
  TargetPropertyEntry *local_50;
  const_iterator local_48;
  __normal_iterator<cmTargetInternals::TargetPropertyEntry_**,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
  local_30;
  iterator position;
  cmGeneratorExpression ge;
  bool before_local;
  cmValueWithOrigin *entry_local;
  cmTarget *this_local;
  
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)&position,&entry->Backtrace)
  ;
  if (before) {
    pcVar1 = cmTargetInternalPointer::operator->(&this->Internal);
    local_30._M_current =
         (TargetPropertyEntry **)
         std::
         vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
         ::begin(&pcVar1->IncludeDirectoriesEntries);
  }
  else {
    pcVar1 = cmTargetInternalPointer::operator->(&this->Internal);
    local_30._M_current =
         (TargetPropertyEntry **)
         std::
         vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
         ::end(&pcVar1->IncludeDirectoriesEntries);
  }
  pcVar1 = cmTargetInternalPointer::operator->(&this->Internal);
  __gnu_cxx::
  __normal_iterator<cmTargetInternals::TargetPropertyEntry*const*,std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>>
  ::__normal_iterator<cmTargetInternals::TargetPropertyEntry**>
            ((__normal_iterator<cmTargetInternals::TargetPropertyEntry*const*,std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>>
              *)&local_48,&local_30);
  this_00 = (TargetPropertyEntry *)operator_new(0x10);
  cmGeneratorExpression::Parse(&local_68,(string *)&position);
  local_60 = (cmCompiledGeneratorExpression *)
             cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_68);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
            (&local_58,(auto_ptr_ref<cmCompiledGeneratorExpression>)local_60);
  cmTargetInternals::TargetPropertyEntry::TargetPropertyEntry
            (this_00,&local_58,&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem);
  local_50 = this_00;
  std::
  vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  ::insert(&pcVar1->IncludeDirectoriesEntries,local_48,&local_50);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_58);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&local_68);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&position);
  return;
}

Assistant:

void cmTarget::InsertInclude(const cmValueWithOrigin &entry,
                     bool before)
{
  cmGeneratorExpression ge(&entry.Backtrace);

  std::vector<cmTargetInternals::TargetPropertyEntry*>::iterator position
                = before ? this->Internal->IncludeDirectoriesEntries.begin()
                         : this->Internal->IncludeDirectoriesEntries.end();

  this->Internal->IncludeDirectoriesEntries.insert(position,
      new cmTargetInternals::TargetPropertyEntry(ge.Parse(entry.Value)));
}